

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockBuilderCopyDockSpace
               (ImGuiID src_dockspace_id,ImGuiID dst_dockspace_id,
               ImVector<const_char_*> *in_window_remap_pairs)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  ImGuiID IVar4;
  int iVar5;
  int *piVar6;
  void *pvVar7;
  ImGuiWindowSettings *pIVar8;
  char *__function;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ImVector<unsigned_int> src_windows;
  ImVector<unsigned_int> node_remap_pairs;
  int *local_70;
  int local_68;
  int *piStack_60;
  ImVector<unsigned_int> local_58;
  char *local_48;
  ImVector<const_char_*> *local_40;
  char *local_38;
  
  if (src_dockspace_id == 0) {
    __assert_fail("src_dockspace_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3db7,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if (dst_dockspace_id == 0) {
    __assert_fail("dst_dockspace_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3db8,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if (in_window_remap_pairs == (ImVector<const_char_*> *)0x0) {
    __assert_fail("in_window_remap_pairs != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3db9,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if (((byte)*in_window_remap_pairs & 1) != 0) {
    __assert_fail("(in_window_remap_pairs->Size % 2) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3dba,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  local_58.Size = 0;
  local_58.Capacity = 0;
  local_58.Data = (uint *)0x0;
  DockBuilderCopyNode(src_dockspace_id,dst_dockspace_id,&local_58);
  local_68 = 0;
  piStack_60 = (int *)0x0;
  iVar3 = *(int *)in_window_remap_pairs;
  iVar11 = 0;
  if (iVar3 < 1) {
    lVar12 = 0;
  }
  else {
    local_70 = (int *)0x0;
    lVar12 = 0;
    uVar9 = 0;
    local_40 = in_window_remap_pairs;
    do {
      if ((long)iVar3 <= (long)(uVar9 | 1)) {
        __function = "T &ImVector<const char *>::operator[](int) [T = const char *]";
        goto LAB_00143c5d;
      }
      local_38 = *(char **)(*(long *)(in_window_remap_pairs + 8) + uVar9 * 8);
      local_48 = *(char **)(*(long *)(in_window_remap_pairs + 8) + (uVar9 | 1) * 8);
      IVar4 = ImHashStr(local_38,0,0);
      piVar6 = local_70;
      iVar3 = iVar11;
      if ((int)lVar12 == iVar11) {
        if (iVar11 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = iVar11 / 2 + iVar11;
        }
        iVar3 = iVar11 + 1;
        if (iVar11 + 1 < iVar5) {
          iVar3 = iVar5;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar6 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar6 = *piVar6 + 1;
        }
        piVar6 = (int *)(*GImAllocatorAllocFunc)((long)iVar3 << 2,GImAllocatorUserData);
        in_window_remap_pairs = local_40;
        piStack_60 = piVar6;
        if (local_70 != (int *)0x0) {
          memcpy(piVar6,local_70,(long)iVar11 << 2);
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(local_70,GImAllocatorUserData);
          in_window_remap_pairs = local_40;
        }
      }
      iVar11 = iVar3;
      piVar6[(int)lVar12] = IVar4;
      lVar12 = (long)local_68 + 1;
      local_68 = (int)lVar12;
      pvVar7 = ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,IVar4);
      if (pvVar7 == (void *)0x0) {
        pIVar8 = FindWindowSettings(IVar4);
        if (pIVar8 == (ImGuiWindowSettings *)0x0) {
          IVar4 = 0;
        }
        else {
          IVar4 = pIVar8->DockId;
        }
      }
      else {
        IVar4 = *(ImGuiID *)((long)pvVar7 + 0x410);
      }
      if (0 < local_58.Size) {
        lVar10 = 0;
        do {
          if (local_58.Data[lVar10] == IVar4) {
            if ((uint)local_58.Size <= (uint)(lVar10 + 1U)) goto LAB_00143c48;
            if (local_58.Data[lVar10 + 1U & 0xffffffff] != 0) {
              DockBuilderDockWindow(local_48,local_58.Data[lVar10 + 1U & 0xffffffff]);
              goto LAB_00143b00;
            }
            break;
          }
          lVar10 = lVar10 + 2;
        } while ((int)lVar10 < local_58.Size);
      }
      DockBuilderCopyWindowSettings(local_38,local_48);
LAB_00143b00:
      uVar9 = uVar9 + 2;
      iVar3 = *(int *)in_window_remap_pairs;
      local_70 = piVar6;
    } while ((int)uVar9 < iVar3);
  }
  if (0 < local_58.Size) {
    uVar9 = 0;
    iVar3 = local_58.Size;
    do {
      if (local_58.Data[uVar9] != 0) {
        if ((long)iVar3 <= (long)(uVar9 | 1)) {
LAB_00143c48:
          __function = "T &ImVector<unsigned int>::operator[](int) [T = unsigned int]";
LAB_00143c5d:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                        ,0x706,__function);
        }
        IVar4 = local_58.Data[uVar9 | 1];
        pvVar7 = ImGuiStorage::GetVoidPtr(&(GImGui->DockContext).Nodes,local_58.Data[uVar9]);
        iVar11 = *(int *)((long)pvVar7 + 0x30);
        if (0 < iVar11) {
          lVar10 = 0;
          do {
            puVar2 = *(undefined8 **)(*(long *)((long)pvVar7 + 0x38) + lVar10 * 8);
            piVar6 = piStack_60;
            do {
              if (piStack_60 + lVar12 <= piVar6) {
                DockBuilderDockWindow((char *)*puVar2,IVar4);
                iVar11 = *(int *)((long)pvVar7 + 0x30);
                break;
              }
              iVar3 = *piVar6;
              piVar6 = piVar6 + 1;
            } while (iVar3 != *(int *)(puVar2 + 1));
            lVar10 = lVar10 + 1;
          } while (lVar10 < iVar11);
          iVar3 = local_58.Size;
        }
      }
      uVar9 = uVar9 + 2;
    } while ((int)uVar9 < iVar3);
  }
  if (piStack_60 != (int *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar6 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar6 = *piVar6 + -1;
    }
    (*GImAllocatorFreeFunc)(piStack_60,GImAllocatorUserData);
  }
  if (local_58.Data != (uint *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar6 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar6 = *piVar6 + -1;
    }
    (*GImAllocatorFreeFunc)(local_58.Data,GImAllocatorUserData);
  }
  return;
}

Assistant:

void ImGui::DockBuilderCopyDockSpace(ImGuiID src_dockspace_id, ImGuiID dst_dockspace_id, ImVector<const char*>* in_window_remap_pairs)
{
    IM_ASSERT(src_dockspace_id != 0);
    IM_ASSERT(dst_dockspace_id != 0);
    IM_ASSERT(in_window_remap_pairs != NULL);
    IM_ASSERT((in_window_remap_pairs->Size % 2) == 0);

    // Duplicate entire dock
    // FIXME: When overwriting dst_dockspace_id, windows that aren't part of our dockspace window class but that are docked in a same node will be split apart,
    // whereas we could attempt to at least keep them together in a new, same floating node.
    ImVector<ImGuiID> node_remap_pairs;
    DockBuilderCopyNode(src_dockspace_id, dst_dockspace_id, &node_remap_pairs);

    // Attempt to transition all the upcoming windows associated to dst_dockspace_id into the newly created hierarchy of dock nodes
    // (The windows associated to src_dockspace_id are staying in place)
    ImVector<ImGuiID> src_windows;
    for (int remap_window_n = 0; remap_window_n < in_window_remap_pairs->Size; remap_window_n += 2)
    {
        const char* src_window_name = (*in_window_remap_pairs)[remap_window_n];
        const char* dst_window_name = (*in_window_remap_pairs)[remap_window_n + 1];
        ImGuiID src_window_id = ImHashStr(src_window_name);
        src_windows.push_back(src_window_id);

        // Search in the remapping tables
        ImGuiID src_dock_id = 0;
        if (ImGuiWindow* src_window = FindWindowByID(src_window_id))
            src_dock_id = src_window->DockId;
        else if (ImGuiWindowSettings* src_window_settings = FindWindowSettings(src_window_id))
            src_dock_id = src_window_settings->DockId;
        ImGuiID dst_dock_id = 0;
        for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
            if (node_remap_pairs[dock_remap_n] == src_dock_id)
            {
                dst_dock_id = node_remap_pairs[dock_remap_n + 1];
                //node_remap_pairs[dock_remap_n] = node_remap_pairs[dock_remap_n + 1] = 0; // Clear
                break;
            }

        if (dst_dock_id != 0)
        {
            // Docked windows gets redocked into the new node hierarchy.
            IMGUI_DEBUG_LOG_DOCKING("Remap live window '%s' 0x%08X -> '%s' 0x%08X\n", src_window_name, src_dock_id, dst_window_name, dst_dock_id);
            DockBuilderDockWindow(dst_window_name, dst_dock_id);
        }
        else
        {
            // Floating windows gets their settings transferred (regardless of whether the new window already exist or not)
            // When this is leading to a Copy and not a Move, we would get two overlapping floating windows. Could we possibly dock them together?
            IMGUI_DEBUG_LOG_DOCKING("Remap window settings '%s' -> '%s'\n", src_window_name, dst_window_name);
            DockBuilderCopyWindowSettings(src_window_name, dst_window_name);
        }
    }

    // Anything else in the source nodes of 'node_remap_pairs' are windows that were docked in src_dockspace_id but are not owned by it (unaffiliated windows, e.g. "ImGui Demo")
    // Find those windows and move to them to the cloned dock node. This may be optional?
    for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
        if (ImGuiID src_dock_id = node_remap_pairs[dock_remap_n])
        {
            ImGuiID dst_dock_id = node_remap_pairs[dock_remap_n + 1];
            ImGuiDockNode* node = DockBuilderGetNode(src_dock_id);
            for (int window_n = 0; window_n < node->Windows.Size; window_n++)
            {
                ImGuiWindow* window = node->Windows[window_n];
                if (src_windows.contains(window->ID))
                    continue;

                // Docked windows gets redocked into the new node hierarchy.
                IMGUI_DEBUG_LOG_DOCKING("Remap window '%s' %08X -> %08X\n", window->Name, src_dock_id, dst_dock_id);
                DockBuilderDockWindow(window->Name, dst_dock_id);
            }
        }
}